

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
rlib::midi::Smf::getFileImage
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,Smf *this)

{
  _List_node_base **pp_Var1;
  undefined1 uVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t sVar4;
  _Rb_tree_node_base *p_Var5;
  long lVar6;
  long lVar7;
  _List_node_base *p_Var8;
  uint uVar9;
  undefined1 *puVar10;
  _List_node_base *p_Var11;
  undefined1 auVar12 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  size_t position;
  Event e;
  list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  trackData;
  anon_class_16_2_cffccc38 fEvent;
  undefined1 local_d9;
  undefined1 local_d8 [16];
  _List_node_base *local_c8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  pointer local_a0;
  undefined1 local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  size_t local_88;
  Event local_80;
  _List_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_68;
  Smf *local_50;
  _List_node_base *local_48;
  anon_class_16_2_cffccc38 local_40;
  
  local_68._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_68;
  local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
  local_68._M_impl._M_node._M_size = 0;
  p_Var11 = (this->tracks).
            super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  local_48 = (_List_node_base *)&this->tracks;
  if (p_Var11 == (_List_node_base *)&this->tracks) {
    uVar9 = 0;
  }
  else {
    local_50 = this;
    do {
      local_d8 = (undefined1  [16])0x0;
      local_c8 = (_List_node_base *)0x0;
      local_88 = 0;
      local_40.position = &local_88;
      p_Var5 = (_Rb_tree_node_base *)p_Var11[2]._M_prev;
      pp_Var1 = &p_Var11[1]._M_prev;
      local_40.v = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8;
      if (p_Var5 != (_Rb_tree_node_base *)pp_Var1) {
        do {
          getFileImage::anon_class_16_2_cffccc38::operator()(&local_40,(Event *)(p_Var5 + 1));
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        } while (p_Var5 != (_Rb_tree_node_base *)pp_Var1);
        p_Var5 = (_Rb_tree_node_base *)p_Var11[2]._M_prev;
      }
      if ((_Rb_tree_node_base *)pp_Var1 == p_Var5) {
LAB_00151f83:
        sVar4 = local_88;
        local_c0._0_8_ = &PTR__EventMeta_00179878;
        local_c0._8_2_ = endOfTrack;
        local_c0._10_2_ = sequenceNo >> 0x10;
        local_a0 = (pointer)0x0;
        local_b0 = (undefined1  [16])0x0;
        local_98 = (undefined1  [8])0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<rlib::midi::EventMeta,std::allocator<rlib::midi::EventMeta>,rlib::midi::EventMeta>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8),
                   (EventMeta **)local_98,(allocator<rlib::midi::EventMeta> *)&local_d9,
                   (EventMeta *)local_c0);
        local_80.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Stack_90._M_pi;
        local_80.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_98;
        _local_98 = (undefined1  [16])0x0;
        local_80.position = sVar4;
        if (local_80.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_80.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_80.event.
                  super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_80.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_80.event.
                  super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_80.event.
                     super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
          }
        }
        local_c0._0_8_ = &PTR__EventMeta_00179878;
        if ((pointer)local_b0._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_b0._0_8_,(long)local_a0 - local_b0._0_8_);
        }
        getFileImage::anon_class_16_2_cffccc38::operator()(&local_40,&local_80);
        if (local_80.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_80.event.
                     super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      else {
        lVar6 = std::_Rb_tree_decrement((_Rb_tree_node_base *)pp_Var1);
        if (*(long *)(lVar6 + 0x28) == 0) goto LAB_00151f83;
        lVar7 = __dynamic_cast(*(long *)(lVar6 + 0x28),&Event::typeinfo,&EventMeta::typeinfo);
        if (lVar7 == 0) goto LAB_00151f83;
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x30);
        if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar3 = *(int *)(lVar7 + 8);
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          iVar3 = *(int *)(lVar7 + 8);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (iVar3 != 0x2f) goto LAB_00151f83;
      }
      local_c0._4_4_ = local_d8._8_4_ - local_d8._0_4_;
      local_c0._0_4_ = 0x6b72544d;
      lVar6 = 4;
      puVar10 = local_c0 + 7;
      do {
        uVar2 = local_c0[lVar6];
        local_c0[lVar6] = *puVar10;
        *puVar10 = uVar2;
        puVar10 = puVar10 + -1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_d8,local_d8._0_8_,
                 local_c0,local_c0 + 8);
      p_Var8 = (_List_node_base *)operator_new(0x28);
      p_Var8[1]._M_next = (_List_node_base *)local_d8._0_8_;
      p_Var8[1]._M_prev = (_List_node_base *)local_d8._8_8_;
      p_Var8[2]._M_next = local_c8;
      local_d8 = (undefined1  [16])0x0;
      local_c8 = (_List_node_base *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      local_68._M_impl._M_node._M_size = local_68._M_impl._M_node._M_size + 1;
      if ((void *)local_d8._0_8_ != (void *)0x0) {
        operator_delete((void *)local_d8._0_8_,(long)local_c8 - local_d8._0_8_);
      }
      p_Var11 = p_Var11->_M_next;
    } while (p_Var11 != local_48);
    uVar9 = (uint)local_68._M_impl._M_node._M_size;
    this = local_50;
  }
  local_c0._12_2_ = (undefined2)this->timeBase;
  puVar10 = local_c0 + 7;
  local_c0._0_8_ = (_func_int **)0x66468544d;
  local_c0._10_2_ = (undefined2)uVar9;
  local_c0._8_2_ = CONCAT11(0,(uVar9 & 0xfffe) != 0);
  lVar6 = 4;
  do {
    uVar2 = local_c0[lVar6];
    local_c0[lVar6] = *puVar10;
    *puVar10 = uVar2;
    puVar10 = puVar10 + -1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  auVar12._2_2_ = local_c0._10_2_;
  auVar12._0_2_ = local_c0._8_2_;
  auVar12._4_2_ = local_c0._12_2_;
  auVar12._6_2_ = local_c0._14_2_;
  auVar12._8_8_ = 0;
  auVar12 = psllw(auVar12,8);
  local_80.position = 0x66468544d;
  local_80.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(CONCAT22(local_80.event.
                         super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._6_2_,local_c0._12_2_ << 8 | (ushort)local_c0._12_2_ >> 8),
                auVar12._0_4_ | (uint)((ushort)local_c0._10_2_ >> 8) << 0x10);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (uchar *)&local_80,
             (uchar *)((long)&local_80.event.
                              super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 6),(allocator_type *)local_c0);
  p_Var11 = (_List_node_base *)&local_68;
  while (p_Var11 = (((_List_impl *)&p_Var11->_M_next)->_M_node).super__List_node_base._M_next,
        p_Var11 != (_List_node_base *)&local_68) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,p_Var11[1]._M_next,p_Var11[1]._M_prev);
  }
  std::__cxx11::
  _List_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::_M_clear(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> Smf::getFileImage() const
{
	std::list<std::vector<uint8_t>> trackData;

	for (auto& track : tracks) {
		std::vector<uint8_t> v;

		size_t position = 0;		// 現在位置

		auto fEvent = [&](const Event& event) {

			{// DeltaTime
				assert(event.position >= position);
				const size_t deltaTime = event.position - position;		// DeltaTime
				position = event.position;								// 現在位置更新
				std::vector<uint8_t> s = midi::inner::getVariableValue(deltaTime);
				v.insert(v.end(), std::make_move_iterator(s.begin()), std::make_move_iterator(s.end()));
			}

			{
				std::vector<uint8_t> t = event.event->midiMessage();
				v.insert(v.end(), std::make_move_iterator(t.begin()), std::make_move_iterator(t.end()));
			}

		};

		for (auto& event : track.events) {
			fEvent(event);
		}

		// EndOfTrackがなければ付ける
		[&] {
			if (auto i = track.events.rbegin(); i != track.events.rend()) {		// 末尾が EndOfTrack ではないなら
				if (auto meta = std::dynamic_pointer_cast<const midi::EventMeta>(i->event)) {
					if (meta->type == midi::EventMeta::Type::endOfTrack) {
						return;
					}
				}
			}
			Event e(position, std::make_shared<midi::EventMeta>(midi::EventMeta::createEndOfTrack()));
			fEvent(e);
		}();

		{// TrackChunk を先頭に挿入
			Inner::TrackChunk trackChunk;
			trackChunk.dataLength = static_cast<uint32_t>(v.size());
			Inner::changeEndian(trackChunk.dataLength);
			v.insert(v.begin(),
				reinterpret_cast<const uint8_t*>(&trackChunk),
				reinterpret_cast<const uint8_t*>(&trackChunk) + sizeof(trackChunk));
		}

		trackData.emplace_back(std::move(v));
	}

	const Inner::HeaderChunk headerChunk = [&] {
		Inner::HeaderChunk h;
		h.trackCount = static_cast<uint16_t>(trackData.size());
		h.format = h.trackCount > 1 ? 1 : 0;
		h.division = timeBase;
		// エンディアン変更
		Inner::changeEndian(h.dataLength);
		Inner::changeEndian(h.format);
		Inner::changeEndian(h.trackCount);
		Inner::changeEndian(h.division);
		return h;
	}();

	std::vector<uint8_t> result(
		reinterpret_cast<const uint8_t*>(&headerChunk),
		reinterpret_cast<const uint8_t*>(&headerChunk) + sizeof(headerChunk));

	for (auto& i : trackData) {
		result.insert(result.end(), std::make_move_iterator(i.begin()), std::make_move_iterator(i.end()));
	}

	return result;
}